

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>
::dx(FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  int iVar8;
  Fad<double> *pFVar9;
  Fad<double> *pFVar10;
  FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>
  *this_00;
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *pFVar11;
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *pFVar12;
  double *pdVar13;
  value_type vVar14;
  double dVar15;
  
  pFVar9 = (this->left_->fadexpr_).left_;
  pFVar10 = (this->left_->fadexpr_).right_;
  pdVar13 = &pFVar9->defaultVal;
  if ((pFVar9->dx_).num_elts != 0) {
    pdVar13 = (pFVar9->dx_).ptr_to_data + i;
  }
  dVar1 = *pdVar13;
  pdVar13 = &pFVar10->defaultVal;
  if ((pFVar10->dx_).num_elts != 0) {
    pdVar13 = (pFVar10->dx_).ptr_to_data + i;
  }
  dVar2 = *pdVar13;
  dVar3 = pFVar9->val_;
  dVar4 = pFVar10->val_;
  this_00 = &this->right_->fadexpr_;
  iVar7 = (this_00->left_->fadexpr_).left_.constant_;
  dVar5 = ((this_00->left_->fadexpr_).right_)->val_;
  iVar8 = (this_00->right_->fadexpr_).left_.constant_;
  dVar6 = ((this_00->right_->fadexpr_).right_)->val_;
  vVar14 = FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>
           ::dx(this_00,i);
  pFVar11 = (this->right_->fadexpr_).left_;
  pFVar12 = (this->right_->fadexpr_).right_;
  dVar15 = ((double)(pFVar12->fadexpr_).left_.constant_ + ((pFVar12->fadexpr_).right_)->val_) *
           ((double)(pFVar11->fadexpr_).left_.constant_ + ((pFVar11->fadexpr_).right_)->val_);
  return (((double)iVar8 + dVar6) * ((double)iVar7 + dVar5) * (dVar1 * dVar4 + dVar2 * dVar3) -
         ((this->left_->fadexpr_).left_)->val_ * ((this->left_->fadexpr_).right_)->val_ * vVar14) /
         (dVar15 * dVar15);
}

Assistant:

const value_type dx(int i) const {return  (left_.dx(i) * right_.val() - right_.dx(i) * left_.val() ) / (right_.val() * right_.val()) ;}